

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  undefined8 this;
  long lVar1;
  undefined1 local_88 [8];
  string comment;
  cmListFileBacktrace local_58;
  undefined1 local_48 [8];
  string message;
  cmMessenger *messenger_local;
  string *value_local;
  string *key_local;
  ostream *fout_local;
  
  message.field_2._8_8_ = messenger;
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (message.field_2._8_8_ != 0) {
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[33]>
                ((string *)local_48,(char (*) [10])0x1270ca6,key,
                 (char (*) [33])" contained a newline; truncating");
      this = message.field_2._8_8_;
      local_58.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_58.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_58);
      cmMessenger::IssueMessage((cmMessenger *)this,WARNING,(string *)local_48,&local_58);
      cmListFileBacktrace::~cmListFileBacktrace(&local_58);
      std::__cxx11::string::~string((string *)local_48);
    }
    cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[56]>
              ((string *)local_88,(char (*) [19])"WARNING: Value of ",key,
               (char (*) [56])" contained a newline and was truncated. Original value:");
    OutputWarningComment(fout,(string *)local_88,true);
    OutputWarningComment(fout,value,false);
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message =
        cmStrCat("Value of ", key, " contained a newline; truncating");
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment =
      cmStrCat("WARNING: Value of ", key,
               " contained a newline and was truncated. Original value:");

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}